

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

uint8 get_marker(jpeg *j)

{
  uint8 uVar1;
  uint8 local_19;
  uint8 x;
  jpeg *j_local;
  
  if (j->marker == 0xff) {
    uVar1 = get8u(&j->s);
    if (uVar1 == 0xff) {
      local_19 = 0xff;
      while (local_19 == 0xff) {
        local_19 = get8u(&j->s);
      }
      j_local._7_1_ = local_19;
    }
    else {
      j_local._7_1_ = 0xff;
    }
  }
  else {
    j_local._7_1_ = j->marker;
    j->marker = 0xff;
  }
  return j_local._7_1_;
}

Assistant:

static uint8 get_marker(jpeg *j)
{
   uint8 x;
   if (j->marker != MARKER_none) { x = j->marker; j->marker = MARKER_none; return x; }
   x = get8u(&j->s);
   if (x != 0xff) return MARKER_none;
   while (x == 0xff)
      x = get8u(&j->s);
   return x;
}